

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie_quant.c
# Opt level: O2

void make_bins(float32 *values,uint32 values_num,float32 *centers,uint32 bins)

{
  float *pfVar1;
  long lVar2;
  float32 *pfVar3;
  ulong uVar4;
  float fVar5;
  float32 fVar6;
  
  qsort(values,(ulong)values_num,4,weights_comparator);
  pfVar3 = values;
  uVar4 = 0;
  while (uVar4 != bins) {
    pfVar1 = (float *)(values + ((uVar4 + 1) * (ulong)values_num) / (ulong)bins);
    lVar2 = (long)pfVar1 - (long)pfVar3;
    if (lVar2 == 0) {
      fVar6 = -2.139095e+09;
      if (uVar4 != 0) {
        fVar6 = centers[-1];
      }
    }
    else {
      fVar5 = 0.0;
      for (; pfVar3 != (float32 *)pfVar1; pfVar3 = (float32 *)((float *)pfVar3 + 1)) {
        fVar5 = fVar5 + (float)*pfVar3;
      }
      fVar6 = (float32)(fVar5 / (float)(lVar2 >> 2));
    }
    *centers = fVar6;
    centers = centers + 1;
    pfVar3 = (float32 *)pfVar1;
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

static void
make_bins(float32 *values, uint32 values_num, float32 *centers, uint32 bins)
{
    float32 *finish, *start;
    uint32 i;

    qsort(values, values_num, sizeof(*values), &weights_comparator);
    start = values;
    for (i = 0; i < bins; i++, centers++, start = finish) {
        finish = values + (size_t) ((uint64) values_num * (i + 1) / bins);
        if (finish == start) {
            /* zero length bucket. */
            *centers = i ? *(centers - 1) : -FLOAT_INF;
        }
        else {
            float32 sum = 0.0f;
            float32 *ptr;
            for (ptr = start; ptr != finish; ptr++) {
                sum += *ptr;
            }
            *centers = sum / (float32) (finish - start);
        }
    }
}